

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DTDValidator::validateAttrValue
          (DTDValidator *this,XMLAttDef *attDef,XMLCh *attrValue,bool preValidation,
          XMLElementDecl *param_4)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  AttTypes AVar5;
  DefAttTypes DVar6;
  int iVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var;
  XMLCh *enumList_00;
  XMLSize_t XVar9;
  XMLScanner *pXVar10;
  MemoryManager *pMVar11;
  ReaderMgr *pRVar12;
  XMLReader *pXVar13;
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *pRVar14;
  MemoryManager *pMVar15;
  DTDEntityDecl *this_00;
  bool bVar16;
  bool bVar17;
  XMLEntityDecl *decl;
  XMLRefInfo *find;
  MemoryManager *pMStack_158;
  bool doNamespace;
  XMLCh *valPtr;
  undefined1 local_140 [8];
  ArrayJanitor<char16_t> janTmpVal;
  XMLCh *pszTmpVal;
  XMLCh tempBuffer [100];
  bool alreadyCapped;
  bool isARefType;
  bool firstNameChar;
  bool multipleValues;
  bool isExternal;
  XMLCh *enumList;
  XMLCh *fullName;
  XMLCh *valueText;
  DefAttTypes defType;
  AttTypes type;
  XMLElementDecl *param_4_local;
  bool preValidation_local;
  XMLCh *attrValue_local;
  XMLAttDef *attDef_local;
  DTDValidator *this_local;
  XMLCh *text1;
  
  AVar5 = XMLAttDef::getType(attDef);
  DVar6 = XMLAttDef::getDefaultType(attDef);
  pXVar8 = XMLAttDef::getValue(attDef);
  iVar7 = (*(attDef->super_XSerializable)._vptr_XSerializable[5])();
  text1 = (XMLCh *)CONCAT44(extraout_var,iVar7);
  enumList_00 = XMLAttDef::getEnumeration(attDef);
  bVar2 = XMLAttDef::isExternal(attDef);
  if (((DVar6 == Fixed) && (!preValidation)) &&
     (bVar3 = XMLString::equals(attrValue,pXVar8), !bVar3)) {
    XMLValidator::emitError
              (&this->super_XMLValidator,NotSameAsFixedValue,text1,attrValue,pXVar8,(XMLCh *)0x0);
  }
  if (AVar5 != AttTypes_Min) {
    if (*attrValue != L'\0') {
      bVar3 = true;
      if (((AVar5 != IDRefs) && (bVar3 = true, AVar5 != Entities)) &&
         ((bVar3 = true, AVar5 != NmTokens && (bVar3 = true, AVar5 != Notation)))) {
        bVar3 = AVar5 == Enumeration;
      }
      bVar16 = true;
      if (((AVar5 != ID) && (bVar16 = true, AVar5 != IDRef)) &&
         ((bVar16 = true, AVar5 != IDRefs &&
          ((bVar16 = true, AVar5 != Entity && (bVar16 = true, AVar5 != Entities)))))) {
        bVar16 = AVar5 == Notation;
      }
      bVar17 = true;
      if ((AVar5 != ID) && (bVar17 = true, AVar5 != IDRef)) {
        bVar17 = AVar5 == IDRefs;
      }
      bVar1 = false;
      janTmpVal.fMemoryManager = (MemoryManager *)0x0;
      ArrayJanitor<char16_t>::ArrayJanitor((ArrayJanitor<char16_t> *)local_140,(char16_t *)0x0);
      XVar9 = XMLString::stringLen(attrValue);
      if (XVar9 < 100) {
        XMLString::copyString((XMLCh *)&pszTmpVal,attrValue);
        janTmpVal.fMemoryManager = (MemoryManager *)&pszTmpVal;
      }
      else {
        pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
        pMVar15 = XMLScanner::getMemoryManager(pXVar10);
        pXVar8 = XMLString::replicate(attrValue,pMVar15);
        pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
        pMVar15 = XMLScanner::getMemoryManager(pXVar10);
        ArrayJanitor<char16_t>::reset((ArrayJanitor<char16_t> *)local_140,pXVar8,pMVar15);
        janTmpVal.fMemoryManager =
             (MemoryManager *)ArrayJanitor<char16_t>::get((ArrayJanitor<char16_t> *)local_140);
      }
      if (bVar3) {
        if (bVar2) {
          pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
          bVar2 = XMLScanner::getStandalone(pXVar10);
          if (bVar2) goto LAB_003fb030;
        }
        pMVar15 = janTmpVal.fMemoryManager;
        pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
        pMVar11 = XMLScanner::getMemoryManager(pXVar10);
        XMLString::collapseWS((XMLCh *)pMVar15,pMVar11);
      }
LAB_003fb030:
      pMStack_158 = janTmpVal.fMemoryManager;
      pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
      bVar2 = XMLScanner::getDoNamespaces(pXVar10);
      do {
        if (bVar16) {
          pRVar12 = XMLValidator::getReaderMgr(&this->super_XMLValidator);
          pXVar13 = ReaderMgr::getCurrentReader(pRVar12);
          bVar4 = XMLReader::isFirstNameChar(pXVar13,*(XMLCh *)&pMStack_158->_vptr_MemoryManager);
          if (!bVar4) {
            XMLValidator::emitError
                      (&this->super_XMLValidator,AttrValNotName,(XMLCh *)pMStack_158,text1,
                       (XMLCh *)0x0,(XMLCh *)0x0);
          }
          pMStack_158 = (MemoryManager *)((long)&pMStack_158->_vptr_MemoryManager + 2);
        }
        for (; *(XMLCh *)&pMStack_158->_vptr_MemoryManager != L'\0';
            pMStack_158 = (MemoryManager *)((long)&pMStack_158->_vptr_MemoryManager + 2)) {
          if (*(XMLCh *)&pMStack_158->_vptr_MemoryManager == L' ') {
            if (!bVar3) {
              XMLValidator::emitError
                        (&this->super_XMLValidator,NoMultipleValues,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                         (XMLCh *)0x0);
              goto LAB_003fb600;
            }
            break;
          }
          if (((bVar2) && (*(XMLCh *)&pMStack_158->_vptr_MemoryManager == L':')) && (bVar16)) {
            XMLValidator::emitError(&this->super_XMLValidator,ColonNotValidWithNS);
          }
          pRVar12 = XMLValidator::getReaderMgr(&this->super_XMLValidator);
          pXVar13 = ReaderMgr::getCurrentReader(pRVar12);
          bVar4 = XMLReader::isNameChar(pXVar13,*(XMLCh *)&pMStack_158->_vptr_MemoryManager);
          if (!bVar4) {
            XMLValidator::emitError
                      (&this->super_XMLValidator,AttrValNotName,(XMLCh *)pMStack_158,text1,
                       (XMLCh *)0x0,(XMLCh *)0x0);
            goto LAB_003fb600;
          }
        }
        if (*(XMLCh *)&pMStack_158->_vptr_MemoryManager == L'\0') {
          bVar1 = true;
        }
        *(XMLCh *)&pMStack_158->_vptr_MemoryManager = L'\0';
        if (bVar17) {
          if (((AVar5 == ID) || (AVar5 == IDRef)) || (AVar5 == IDRefs)) {
            pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
            pRVar14 = XMLScanner::getIDRefList(pXVar10);
            decl = (XMLEntityDecl *)
                   RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::get
                             (pRVar14,janTmpVal.fMemoryManager);
            if (decl == (XMLEntityDecl *)0x0) {
              pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
              pMVar15 = XMLScanner::getMemoryManager(pXVar10);
              decl = (XMLEntityDecl *)XMemory::operator_new(0x20,pMVar15);
              pMVar15 = janTmpVal.fMemoryManager;
              pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
              pMVar11 = XMLScanner::getMemoryManager(pXVar10);
              XMLRefInfo::XMLRefInfo((XMLRefInfo *)decl,(XMLCh *)pMVar15,false,false,pMVar11);
              pXVar10 = XMLValidator::getScanner(&this->super_XMLValidator);
              pRVar14 = XMLScanner::getIDRefList(pXVar10);
              pXVar8 = XMLRefInfo::getRefName((XMLRefInfo *)decl);
              RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                        (pRVar14,pXVar8,(XMLRefInfo *)decl);
            }
            else {
              bVar4 = XMLRefInfo::getDeclared((XMLRefInfo *)decl);
              if ((bVar4) && (AVar5 == ID)) {
                XMLValidator::emitError
                          (&this->super_XMLValidator,ReusedIDValue,(XMLCh *)janTmpVal.fMemoryManager
                           ,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
              }
            }
            if (AVar5 == ID) {
              XMLRefInfo::setDeclared((XMLRefInfo *)decl,true);
            }
            else if (!preValidation) {
              XMLRefInfo::setUsed((XMLRefInfo *)decl,true);
            }
          }
        }
        else if ((preValidation) || ((AVar5 != Entity && (AVar5 != Entities)))) {
          if (((AVar5 == Notation) || (AVar5 == Enumeration)) &&
             (bVar4 = XMLString::isInList((XMLCh *)janTmpVal.fMemoryManager,enumList_00), !bVar4)) {
            XMLValidator::emitError
                      (&this->super_XMLValidator,DoesNotMatchEnumList,
                       (XMLCh *)janTmpVal.fMemoryManager,text1,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        else {
          this_00 = DTDGrammar::getEntityDecl(this->fDTDGrammar,(XMLCh *)janTmpVal.fMemoryManager);
          if (this_00 == (DTDEntityDecl *)0x0) {
            XMLValidator::emitError
                      (&this->super_XMLValidator,UnknownEntityRefAttr,text1,
                       (XMLCh *)janTmpVal.fMemoryManager,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          else {
            bVar4 = XMLEntityDecl::isUnparsed(&this_00->super_XMLEntityDecl);
            if (!bVar4) {
              XMLValidator::emitError
                        (&this->super_XMLValidator,BadEntityRefAttr,
                         (XMLCh *)janTmpVal.fMemoryManager,text1,(XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
        }
        if ((!bVar3) || (bVar1)) {
LAB_003fb600:
          ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_140);
          return;
        }
        pMStack_158 = (MemoryManager *)((long)&pMStack_158->_vptr_MemoryManager + 2);
        janTmpVal.fMemoryManager = pMStack_158;
      } while( true );
    }
    XMLValidator::emitError
              (&this->super_XMLValidator,InvalidEmptyAttValue,text1,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  return;
}

Assistant:

void
DTDValidator::validateAttrValue(const   XMLAttDef*      attDef
                                , const XMLCh* const    attrValue
                                , bool                  preValidation
                                , const XMLElementDecl*)
{
    //
    //  Get quick refs to lost of of the stuff in the passed objects in
    //  order to simplify the code below, which will reference them very
    //  often.
    //
    const XMLAttDef::AttTypes       type = attDef->getType();
    const XMLAttDef::DefAttTypes    defType = attDef->getDefaultType();
    const XMLCh* const              valueText = attDef->getValue();
    const XMLCh* const              fullName = attDef->getFullName();
    const XMLCh* const              enumList = attDef->getEnumeration();
    const bool                      isExternal = attDef->isExternal();

    //
    //  If the default type is fixed, then make sure the passed value maps
    //  to the fixed value.
    //  If during preContentValidation, the value we are validating is the fixed value itself
    //  so no need to compare.
    //  Only need to do this for regular attribute value validation
    //
    if (defType == XMLAttDef::Fixed && !preValidation)
    {
        if (!XMLString::equals(attrValue, valueText))
            emitError(XMLValid::NotSameAsFixedValue, fullName, attrValue, valueText);
    }

    //
    //  If its a CDATA attribute, then we are done with any DTD level
    //  validation else do the rest.
    //
    if (type == XMLAttDef::CData)
        return;



    // An empty string cannot be valid for any of the other types
    if (!attrValue[0])
    {
        emitError(XMLValid::InvalidEmptyAttValue, fullName);
        return;
    }

    // See whether we are doing multiple values or not
    const bool multipleValues =
    (
        (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::NmTokens)
        || (type == XMLAttDef::Notation)
        || (type == XMLAttDef::Enumeration)
    );

    // And whether we must check for a first name char
    const bool firstNameChar =
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entity)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::Notation)
    );

    // Whether it requires ref checking stuff
    const bool isARefType
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
    );

    // Some trigger flags to avoid issuing redundant errors and whatnot    
    bool alreadyCapped = false;

    //
    //  Make a copy of the text that we can mangle and get a pointer we can
    //  move through the value
    //

    // Use a stack-based buffer, when possible...
    XMLCh   tempBuffer[100];

    XMLCh* pszTmpVal = 0;

    ArrayJanitor<XMLCh> janTmpVal(0);

    if (XMLString::stringLen(attrValue) < sizeof(tempBuffer) / sizeof(tempBuffer[0]))
    {
        XMLString::copyString(tempBuffer, attrValue);
        pszTmpVal = tempBuffer;
    }
    else
    {
        janTmpVal.reset(XMLString::replicate(attrValue, getScanner()->getMemoryManager()), getScanner()->getMemoryManager());
        pszTmpVal = janTmpVal.get();
    }

    //  if the type is an enumeration, normalize it, unless standalone = yes is specified
    //  "The standalone document declaration MUST have the value "no" if any external markup declarations contain declarations of:
    //   - ...
    //   - attributes with tokenized types, where the attribute appears in the document with a value such that normalization will 
    //     produce a different value from that which would be produced in the absence of the declaration"
    if (multipleValues && (!isExternal || !getScanner()->getStandalone()))
        XMLString::collapseWS(pszTmpVal, getScanner()->getMemoryManager());

    XMLCh* valPtr = pszTmpVal;

    bool doNamespace = getScanner()->getDoNamespaces();

    while (true)
    {
        //
        //  Make sure the first character is a valid first name char, i.e.
        //  if its a Name value. For NmToken values we don't treat the first
        //  char any differently.
        //
        if (firstNameChar)
        {
            // If its not, emit and error but try to keep going
            if (!getReaderMgr()->getCurrentReader()->isFirstNameChar(*valPtr))
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
            valPtr++;
        }

        // Make sure all the remaining chars are valid name chars
        while (*valPtr)
        {
            //
            //  If we hit a whitespace, its either a break between two
            //  or more values, or an error if we have a single value.
            //
            //
            //   XML1.0-3rd
            //
            //   [6]   Names   ::=   Name (#x20 Name)*
            //   [8]   Nmtokens   ::=   Nmtoken (#x20 Nmtoken)*
            //
            //   only and only ONE #x20 is allowed to be the delimiter
            //
            if (*valPtr==chSpace)
            {
                if (!multipleValues)
                {
                    emitError(XMLValid::NoMultipleValues, fullName);
                    return;
                }

                break;
            }

            // Now this attribute can be of type
            //     ID, IDREF, IDREFS, ENTITY, ENTITIES, NOTATION, NMTOKEN, NMTOKENS, ENUMERATION
            //  All these must be valid XMLName
            // If namespace is enabled, colon is not allowed in the first 6

            if (doNamespace && *valPtr == chColon && firstNameChar)
                emitError(XMLValid::ColonNotValidWithNS);

            if (!getReaderMgr()->getCurrentReader()->isNameChar(*valPtr))
            {
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
                return;
            }
            valPtr++;
        }

        //
        //  Cap it off at the current non-name char. If already capped,
        //  then remember this.
        //
        if (!(*valPtr))
            alreadyCapped = true;
        *valPtr = 0;

        //
        //  If this type of attribute requires that we track reference
        //  stuff, then handle that.
        //
        if (isARefType)
        {
            if ((type == XMLAttDef::ID)
            ||  (type == XMLAttDef::IDRef)
            ||  (type == XMLAttDef::IDRefs))
            {
                XMLRefInfo* find = getScanner()->getIDRefList()->get(pszTmpVal);
                if (find)
                {
                    if (find->getDeclared() && (type == XMLAttDef::ID))
                        emitError(XMLValid::ReusedIDValue, pszTmpVal);
                }
                 else
                {
                    find = new (getScanner()->getMemoryManager()) XMLRefInfo
                    (
                        pszTmpVal
                        , false
                        , false
                        , getScanner()->getMemoryManager()
                    );
                    getScanner()->getIDRefList()->put((void*)find->getRefName(), find);
                }

                //
                //  Mark it declared or used, which might be redundant in some cases
                //  but not worth checking
                //
                if (type == XMLAttDef::ID)
                    find->setDeclared(true);
                else {
                    if (!preValidation) {
                        find->setUsed(true);
                    }
                }
            }
        }
         else if (!preValidation && ((type == XMLAttDef::Entity) || (type == XMLAttDef::Entities)))
        {
            //
            //  If its refering to a entity, then look up the name in the
            //  general entity pool. If not there, then its an error. If its
            //  not an external unparsed entity, then its an error.
            //
            //  In case of pre-validation, the above errors should be ignored.
            //
            const XMLEntityDecl* decl = fDTDGrammar->getEntityDecl(pszTmpVal);
            if (decl)
            {
                if (!decl->isUnparsed())
                    emitError(XMLValid::BadEntityRefAttr, pszTmpVal, fullName);
            }
             else
            {
                emitError
                (
                    XMLValid::UnknownEntityRefAttr
                    , fullName
                    , pszTmpVal
                );
            }
        }
         else if ((type == XMLAttDef::Notation) || (type == XMLAttDef::Enumeration))
        {
            //
            //  Make sure that this value maps to one of the enumeration or
            //  notation values in the enumList parameter. We don't have to
            //  look it up in the notation pool (if a notation) because we
            //  will look up the enumerated values themselves. If they are in
            //  the notation pool (after the DTD is parsed), then obviously
            //  this value will be legal since it matches one of them.
            //
            if (!XMLString::isInList(pszTmpVal, enumList))
                emitError(XMLValid::DoesNotMatchEnumList, pszTmpVal, fullName);
        }

        // If not doing multiple values, then we are done
        if (!multipleValues)
            break;

        //
        //  If we are at the end, then break out now, else move up to the
        //  next char and update the base pointer.
        //
        if (alreadyCapped)
            break;

        valPtr++;
        pszTmpVal = valPtr;
    }

}